

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O0

size_t __thiscall meshopt::VertexStreamHasher::hash(VertexStreamHasher *this,uint index)

{
  long *plVar1;
  uint in_ESI;
  long *in_RDI;
  uchar *data;
  meshopt_Stream *s;
  size_t i;
  uint h;
  ulong local_18;
  uint local_10;
  
  local_10 = 0;
  for (local_18 = 0; local_18 < (ulong)in_RDI[1]; local_18 = local_18 + 1) {
    plVar1 = (long *)(*in_RDI + local_18 * 0x18);
    local_10 = hashUpdate4(local_10,(uchar *)(*plVar1 + (ulong)in_ESI * plVar1[2]),plVar1[1]);
  }
  return (ulong)local_10;
}

Assistant:

size_t hash(unsigned int index) const
	{
		unsigned int h = 0;

		for (size_t i = 0; i < stream_count; ++i)
		{
			const meshopt_Stream& s = streams[i];
			const unsigned char* data = static_cast<const unsigned char*>(s.data);

			h = hashUpdate4(h, data + index * s.stride, s.size);
		}

		return h;
	}